

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

int __thiscall mpt::layout::bind(layout *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  convertable *this_00;
  layout *plVar1;
  object *from;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  graph *this_01;
  char *id;
  undefined4 extraout_var_00;
  item<mpt::layout::graph> *piVar4;
  graph *from_00;
  long lVar5;
  undefined4 extraout_var_01;
  content<mpt::item<mpt::metatype>_> *pcVar6;
  undefined4 in_register_00000034;
  reference<mpt::content<mpt::item<mpt::layout::graph>_>_> rVar7;
  content<mpt::item<mpt::metatype>_> *pcVar8;
  content<mpt::item<mpt::metatype>_> *pcVar9;
  unique_array<mpt::item<mpt::layout::graph>_> uVar10;
  item_array<mpt::layout::graph> arr;
  relation me;
  unique_array<mpt::item<mpt::layout::graph>_> local_60;
  layout *local_58;
  object *local_50;
  undefined8 local_48;
  group *local_40;
  undefined1 local_38;
  
  pcVar9 = (this->super_item_group)._items.super_unique_array<mpt::item<mpt::metatype>_>._ref._ref;
  if (pcVar9 == (content<mpt::item<mpt::metatype>_> *)0x0) {
    pcVar9 = (content<mpt::item<mpt::metatype>_> *)0x0;
  }
  else {
    iVar3 = (*(pcVar9->super_buffer)._vptr_buffer[2])(pcVar9);
    if (CONCAT44(extraout_var,iVar3) == 0) {
      pcVar9 = (content<mpt::item<mpt::metatype>_> *)0x0;
    }
  }
  if (CONCAT44(in_register_00000034,__fd) == 0) {
    local_40 = &(this->super_item_group).super_group;
    local_50 = (object *)&PTR_find_001474a8;
    local_48 = 0;
    local_38 = 0x2e;
    iVar3 = item_group::bind(&this->super_item_group,(int)&local_50,__addr,0x1474a8);
  }
  else {
    iVar3 = item_group::bind(&this->super_item_group,__fd,__addr,__len);
  }
  if (-1 < iVar3) {
    unique_array<mpt::item<mpt::layout::graph>_>::unique_array(&local_60,-1);
    pcVar6 = (this->super_item_group)._items.super_unique_array<mpt::item<mpt::metatype>_>._ref._ref
    ;
    pcVar8 = pcVar6 + 1;
    local_58 = this;
    if (pcVar6 == (content<mpt::item<mpt::metatype>_> *)0x0) {
      pcVar6 = (content<mpt::item<mpt::metatype>_> *)0x0;
      pcVar8 = (content<mpt::item<mpt::metatype>_> *)0x0;
    }
    else {
      pcVar6 = (content<mpt::item<mpt::metatype>_> *)
               ((long)&(pcVar8->super_buffer)._vptr_buffer +
               ((pcVar6->super_buffer)._used & 0xffffffffffffffe0));
    }
    for (; plVar1 = local_58, uVar10._ref._ref = local_60._ref._ref, pcVar8 != pcVar6;
        pcVar8 = pcVar8 + 1) {
      this_00 = (convertable *)(pcVar8->super_buffer)._vptr_buffer;
      if ((this_00 != (convertable *)0x0) &&
         (this_01 = convertable::operator_cast_to_graph_(this_00), this_01 != (graph *)0x0)) {
        id = identifier::name((identifier *)&(pcVar8->super_buffer)._content_traits);
        iVar3 = (*(this_01->super_item_group).super_metatype.super_convertable._vptr_convertable[2])
                          (this_01);
        if (CONCAT44(extraout_var_00,iVar3) == 0) {
          from_00 = convertable::operator_cast_to_graph_(this_00);
          if (from_00 != (graph *)0x0) {
            local_50 = (object *)0x0;
            iVar3 = (**this_00->_vptr_convertable)(this_00,0x84,&local_50);
            from = local_50;
            if (local_50 != (object *)0x0 && -1 < iVar3) {
              this_01 = (graph *)operator_new(0x68);
              graph::graph(this_01,from_00);
              bVar2 = object::set(&this_01->super_object,from,(logger *)__addr);
              if (!bVar2) {
                (*(this_01->super_item_group).super_metatype.super_convertable._vptr_convertable[1])
                          (this_01);
                goto LAB_00135221;
              }
              goto LAB_00135203;
            }
          }
          if (__addr != (sockaddr *)0x0) {
            if ((id == (char *)0x0) || (*id == '\0')) {
              logger::message((logger *)__addr,"mpt::layout::bind",4,"%s",
                              "unable to get graph information");
            }
            else {
              logger::message((logger *)__addr,"mpt::layout::bind",4,"%s: %s",
                              "unable to get graph information",id);
            }
          }
        }
        else {
LAB_00135203:
          piVar4 = item_array<mpt::layout::graph>::append
                             ((item_array<mpt::layout::graph> *)&local_60,this_01,id,-1);
          if (piVar4 == (item<mpt::layout::graph> *)0x0) {
            (*(this_01->super_item_group).super_metatype.super_convertable._vptr_convertable[1])
                      (this_01);
            plVar1 = local_58;
            pcVar8 = (local_58->super_item_group)._items.
                     super_unique_array<mpt::item<mpt::metatype>_>._ref._ref;
            if (pcVar9 != pcVar8) {
              if (pcVar9 == (content<mpt::item<mpt::metatype>_> *)0x0) {
                pcVar6 = (content<mpt::item<mpt::metatype>_> *)0x0;
              }
              else {
                iVar3 = (*(pcVar9->super_buffer)._vptr_buffer[2])(pcVar9);
                pcVar6 = (content<mpt::item<mpt::metatype>_> *)CONCAT44(extraout_var_01,iVar3);
                if ((content<mpt::item<mpt::metatype>_> *)CONCAT44(extraout_var_01,iVar3) !=
                    (content<mpt::item<mpt::metatype>_> *)0x0) {
                  pcVar6 = pcVar9;
                }
                pcVar8 = (plVar1->super_item_group)._items.
                         super_unique_array<mpt::item<mpt::metatype>_>._ref._ref;
              }
              if (pcVar8 != (content<mpt::item<mpt::metatype>_> *)0x0) {
                (*(pcVar8->super_buffer)._vptr_buffer[1])();
              }
              (plVar1->super_item_group)._items.super_unique_array<mpt::item<mpt::metatype>_>._ref.
              _ref = pcVar6;
            }
            iVar3 = 0;
            goto LAB_00135374;
          }
        }
      }
LAB_00135221:
    }
    rVar7._ref = (local_58->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref;
    if (local_60._ref._ref == (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)rVar7._ref)
    {
      iVar3 = 1;
    }
    else {
      if (local_60._ref._ref == (content<mpt::item<mpt::layout::graph>_> *)0x0) {
        uVar10._ref._ref =
             (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
             (content<mpt::item<mpt::layout::graph>_> *)0x0;
      }
      else {
        lVar5 = (**(code **)(*(long *)local_60._ref._ref + 0x10))(local_60._ref._ref);
        if (lVar5 == 0) {
          uVar10._ref._ref =
               (reference<mpt::content<mpt::item<mpt::layout::graph>_>_>)
               (content<mpt::item<mpt::layout::graph>_> *)0x0;
        }
        rVar7._ref = (plVar1->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref;
      }
      if (rVar7._ref != (content<mpt::item<mpt::layout::graph>_> *)0x0) {
        (*((rVar7._ref)->super_buffer)._vptr_buffer[1])();
      }
      (plVar1->_graphs).super_unique_array<mpt::item<mpt::layout::graph>_>._ref._ref =
           (content<mpt::item<mpt::layout::graph>_> *)uVar10._ref._ref;
      iVar3 = 1;
    }
LAB_00135374:
    if (local_60._ref._ref != (content<mpt::item<mpt::layout::graph>_> *)0x0) {
      (*(((content<mpt::item<mpt::layout::graph>_> *)local_60._ref._ref)->super_buffer)._vptr_buffer
        [1])(local_60._ref._ref);
    }
  }
  if (pcVar9 != (content<mpt::item<mpt::metatype>_> *)0x0) {
    (*(pcVar9->super_buffer)._vptr_buffer[1])(pcVar9);
  }
  return iVar3;
}

Assistant:

int layout::bind(const relation *rel, logger *out)
{
	item_array<metatype> old = _items;
	int ret = 0;
	
	if (!rel) {
		collection::relation me(*this);
		ret = item_group::bind(&me, out);
	} else {
		ret = item_group::bind(rel, out);
	}
	if (ret < 0) {
		return ret;
	}
	item_array<graph> arr;
	
	for (auto &it : _items) {
		metatype *mt;
		graph *g;
		if (!(mt = it.instance()) || !(g = *mt)) {
			continue;
		}
		const char *name = it.name();
		if (!g->addref()) {
			static const char _func[] = "mpt::layout::bind\0";
			::mpt::graph *d;
			object *o = 0;
			if (!(d = *mt) || !(o = *mt)) {
				const char *msg = MPT_tr("unable to get graph information");
				if (out) {
					if (!name || !*name) {
						out->message(_func, out->Warning, "%s", msg);
					} else {
						out->message(_func, out->Warning, "%s: %s", msg, name);
					}
				}
				continue;
			}
			g = new graph(d);
			
			if (o && !g->set(*o, out)) {
				g->unref();
				continue;
			}
		}
		if (!arr.append(g, name)) {
			g->unref();
			_items = old;
			return false;
		}
	}
	_graphs = arr;
	return true;
}